

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O2

BOOL __thiscall
Js::GlobalObject::StrictEquals
          (GlobalObject *this,Var other,BOOL *value,ScriptContext *requestContext)

{
  RecyclableObject *pRVar1;
  HostObjectBase *pHVar2;
  int iVar3;
  BOOL BVar4;
  
  if (this == (GlobalObject *)other) {
    *value = 1;
    BVar4 = 1;
  }
  else {
    pRVar1 = (this->directHostObject).ptr;
    if (pRVar1 != (RecyclableObject *)0x0) {
      iVar3 = (*(pRVar1->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x2f])(pRVar1);
      return iVar3;
    }
    pHVar2 = (this->super_RootObjectBase).hostObject.ptr;
    if (pHVar2 != (HostObjectBase *)0x0) {
      BVar4 = (**(code **)(*(long *)pHVar2 + 0x178))();
      return BVar4;
    }
    *value = 0;
    BVar4 = 0;
  }
  return BVar4;
}

Assistant:

BOOL GlobalObject::StrictEquals(__in Js::Var other, __out BOOL* value, ScriptContext * requestContext)
    {
        if (this == other)
        {
            *value = TRUE;
            return TRUE;
        }
        else if (this->directHostObject)
        {
            return this->directHostObject->StrictEquals(other, value, requestContext);
        }
        else if (this->hostObject)
        {
            return this->hostObject->StrictEquals(other, value, requestContext);
        }
        *value = FALSE;
        return FALSE;
    }